

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O0

void NodeDump(nodecontext *p,textwriter_conflict *Text)

{
  long *local_20;
  node **i;
  textwriter_conflict *Text_local;
  nodecontext *p_local;
  
  if (p == (nodecontext *)0xffffffffffffffa0) {
    __assert_fail("&(p->NodeSingleton)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                  ,0x497,"void NodeDump(nodecontext *, textwriter *)");
  }
  local_20 = (long *)(p->NodeSingleton)._Begin;
  while( true ) {
    if (p == (nodecontext *)0xffffffffffffffa0) {
      __assert_fail("&(p->NodeSingleton)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                    ,0x497,"void NodeDump(nodecontext *, textwriter *)");
    }
    if (local_20 ==
        (long *)((p->NodeSingleton)._Begin + ((p->NodeSingleton)._Used & 0xfffffffffffffff8)))
    break;
    if (*local_20 != 0) {
      NodeDumpObject((node *)*local_20,Text);
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void NodeDump(nodecontext* p,textwriter* Text)
{
    //no NodeLock, because may be stayed locked when dumping after crash
    node **i;
    for (i=ARRAYBEGIN(p->NodeSingleton,node*);i!=ARRAYEND(p->NodeSingleton,node*);++i)
        if (*i)
            NodeDumpObject(*i,Text);
}